

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void rec_for_check(jit_State *J,IRType t,int dir,TRef stop,TRef step,int init)

{
  uint uVar1;
  IRRef1 IVar2;
  TRef TVar3;
  IRRef1 IVar4;
  IRRef1 IVar5;
  
  IVar4 = (IRRef1)step;
  IVar5 = (IRRef1)stop;
  if ((short)IVar4 < 0) {
    if (t == IRT_IGC) {
      TVar3 = lj_ir_kint(J,0);
      IVar2 = (IRRef1)TVar3;
    }
    else {
      TVar3 = lj_ir_knum_u64(J,0);
      IVar2 = (IRRef1)TVar3;
    }
    (J->fold).ins.field_0.ot = (ushort)(dir != 0) << 8 | (ushort)t | 0x80;
    (J->fold).ins.field_0.op1 = IVar4;
    (J->fold).ins.field_0.op2 = IVar2;
    lj_opt_fold(J);
    if (init == 0 || t != IRT_IGC) {
      return;
    }
    if ((short)IVar5 < 0) {
      (J->fold).ins.field_0.ot = 0x3593;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = IVar5;
      TVar3 = lj_opt_fold(J);
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x12130000;
      goto LAB_00144ecf;
    }
    uVar1 = (J->cur).ir[stop & 0x7fff].i;
    if (dir == 0) {
      if (-1 < (int)uVar1) {
        return;
      }
      TVar3 = lj_ir_kint(J,-0x80000000 - uVar1);
      IVar2 = (IRRef1)TVar3;
      (J->fold).ins.field_0.ot = 0x193;
    }
    else {
      if ((int)uVar1 < 1) {
        return;
      }
      TVar3 = lj_ir_kint(J,uVar1 ^ 0x7fffffff);
      IVar2 = (IRRef1)TVar3;
      (J->fold).ins.field_0.ot = 0x293;
    }
    (J->fold).ins.field_0.op1 = IVar4;
  }
  else {
    if (((-1 < (short)IVar5) || (t != IRT_IGC)) || (init == 0)) {
      return;
    }
    TVar3 = lj_ir_kint(J,((uint)(dir == 0) - (J->cur).ir[step & 0x7fff].field_1.op12) + 0x7fffffff);
    IVar2 = (IRRef1)TVar3;
    (J->fold).ins.field_0.ot = (ushort)(dir != 0) * 0x100 + 0x193;
    (J->fold).ins.field_0.op1 = IVar5;
  }
  (J->fold).ins.field_0.op2 = IVar2;
LAB_00144ecf:
  lj_opt_fold(J);
  return;
}

Assistant:

static void rec_for_check(jit_State *J, IRType t, int dir,
			  TRef stop, TRef step, int init)
{
  if (!tref_isk(step)) {
    /* Non-constant step: need a guard for the direction. */
    TRef zero = (t == IRT_INT) ? lj_ir_kint(J, 0) : lj_ir_knum_zero(J);
    emitir(IRTG(dir ? IR_GE : IR_LT, t), step, zero);
    /* Add hoistable overflow checks for a narrowed FORL index. */
    if (init && t == IRT_INT) {
      if (tref_isk(stop)) {
	/* Constant stop: optimize check away or to a range check for step. */
	int32_t k = IR(tref_ref(stop))->i;
	if (dir) {
	  if (k > 0)
	    emitir(IRTGI(IR_LE), step, lj_ir_kint(J, (int32_t)0x7fffffff-k));
	} else {
	  if (k < 0)
	    emitir(IRTGI(IR_GE), step, lj_ir_kint(J, (int32_t)0x80000000-k));
	}
      } else {
	/* Stop+step variable: need full overflow check. */
	TRef tr = emitir(IRTGI(IR_ADDOV), step, stop);
	emitir(IRTI(IR_USE), tr, 0);  /* ADDOV is weak. Avoid dead result. */
      }
    }
  } else if (init && t == IRT_INT && !tref_isk(stop)) {
    /* Constant step: optimize overflow check to a range check for stop. */
    int32_t k = IR(tref_ref(step))->i;
    k = (int32_t)(dir ? 0x7fffffff : 0x80000000) - k;
    emitir(IRTGI(dir ? IR_LE : IR_GE), stop, lj_ir_kint(J, k));
  }
}